

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Twine.cpp
# Opt level: O1

StringRef __thiscall llvm::Twine::toNullTerminatedStringRef(Twine *this,SmallVectorImpl<char> *Out)

{
  NodeKind NVar1;
  ulong in_RAX;
  size_t sVar2;
  ulong uVar3;
  char *__s;
  StringRef SVar4;
  undefined8 uStack_18;
  
  NVar1 = this->LHSKind;
  if (EmptyKind < NVar1 && this->RHSKind == EmptyKind) {
    if (NVar1 == StdStringKind) {
      __s = (char *)*(this->LHS).decUL;
      sVar2 = (this->LHS).decUL[1];
      goto LAB_00dbb522;
    }
    if (NVar1 == CStringKind) {
      __s = (this->LHS).cString;
      if (__s == (char *)0x0) {
        sVar2 = 0;
      }
      else {
        sVar2 = strlen(__s);
      }
      goto LAB_00dbb522;
    }
  }
  uStack_18 = in_RAX;
  toVector(this,Out);
  uStack_18 = uStack_18 & 0xffffffffffffff;
  SmallVectorTemplateBase<char,_true>::push_back
            (&Out->super_SmallVectorTemplateBase<char,_true>,(char *)((long)&uStack_18 + 7));
  uVar3 = (ulong)(Out->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size - 1;
  if ((Out->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Capacity < uVar3) {
    __assert_fail("N <= capacity()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                  ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
  }
  (Out->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = (uint)uVar3;
  __s = (char *)(Out->super_SmallVectorTemplateBase<char,_true>).
                super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  sVar2 = uVar3 & 0xffffffff;
LAB_00dbb522:
  SVar4.Length = sVar2;
  SVar4.Data = __s;
  return SVar4;
}

Assistant:

StringRef Twine::toNullTerminatedStringRef(SmallVectorImpl<char> &Out) const {
  if (isUnary()) {
    switch (getLHSKind()) {
    case CStringKind:
      // Already null terminated, yay!
      return StringRef(LHS.cString);
    case StdStringKind: {
      const std::string *str = LHS.stdString;
      return StringRef(str->c_str(), str->size());
    }
    default:
      break;
    }
  }
  toVector(Out);
  Out.push_back(0);
  Out.pop_back();
  return StringRef(Out.data(), Out.size());
}